

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int ran_pending;
  int r;
  int timeout;
  uv_run_mode mode_local;
  uv_loop_t *loop_local;
  
  local_1c = uv__loop_alive(loop);
  if (local_1c == 0) {
    uv__update_time(loop);
  }
  while( true ) {
    bVar2 = false;
    if (local_1c != 0) {
      bVar2 = loop->stop_flag == 0;
    }
    if (!bVar2) break;
    uv__update_time(loop);
    uv__run_timers(loop);
    iVar1 = uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);
    ran_pending = 0;
    if (((mode == UV_RUN_ONCE) && (iVar1 == 0)) || (mode == UV_RUN_DEFAULT)) {
      ran_pending = uv_backend_timeout(loop);
    }
    uv__io_poll(loop,ran_pending);
    uv__run_check(loop);
    uv__run_closing_handles(loop);
    if (mode == UV_RUN_ONCE) {
      uv__update_time(loop);
      uv__run_timers(loop);
    }
    local_1c = uv__loop_alive(loop);
    if ((mode == UV_RUN_ONCE) || (mode == UV_RUN_NOWAIT)) break;
  }
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return local_1c;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int ran_pending;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);
    ran_pending = uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && !ran_pending) || mode == UV_RUN_DEFAULT)
      timeout = uv_backend_timeout(loop);

    uv__io_poll(loop, timeout);
    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}